

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
google::protobuf::json_internal::anon_unknown_5::
ParseStrOrBytes<google::protobuf::json_internal::ParseProto2Descriptor>
          (StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,anon_unknown_5 *this,JsonLexer *lex,
          Field<google::protobuf::json_internal::ParseProto2Descriptor> field)

{
  undefined8 uVar1;
  bool bVar2;
  Type TVar3;
  Status *pSVar4;
  LocationWith<google::protobuf::json_internal::MaybeOwnedString> *pLVar5;
  Nullable<char_*> ptr;
  size_t size;
  Span<char> *this_00;
  string *u;
  string_view sVar6;
  Span<char> base64;
  undefined1 local_c8 [16];
  pointer local_b8;
  undefined1 local_b0 [8];
  StatusOr<absl::lts_20240722::Span<char>_> decoded;
  string *b64;
  Status local_80;
  Status _status;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  str;
  Field<google::protobuf::json_internal::ParseProto2Descriptor> field_local;
  JsonLexer *lex_local;
  
  JsonLexer::ParseUtf8
            ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              *)&_status,(JsonLexer *)this);
  pSVar4 = absl::lts_20240722::
           StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
           ::status((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)&_status);
  absl::lts_20240722::Status::Status(&local_80,pSVar4);
  bVar2 = absl::lts_20240722::Status::ok(&local_80);
  bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
  if (bVar2) {
    absl::lts_20240722::
    StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    StatusOr<const_absl::lts_20240722::Status,_0>(__return_storage_ptr__,&local_80);
  }
  absl::lts_20240722::Status::~Status(&local_80);
  if (!bVar2) {
    TVar3 = Proto2Descriptor::FieldType((Field)lex);
    if (TVar3 == TYPE_BYTES) {
      pLVar5 = absl::lts_20240722::
               StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
               ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)&_status);
      decoded.super_StatusOrData<absl::lts_20240722::Span<char>_>.field_1.data_.len_ =
           (size_type)MaybeOwnedString::ToString_abi_cxx11_(&pLVar5->value);
      ptr = (Nullable<char_*>)
            std::__cxx11::string::operator[]
                      (decoded.super_StatusOrData<absl::lts_20240722::Span<char>_>.field_1.data_.
                       len_);
      size = std::__cxx11::string::size();
      join_0x00000010_0x00000000_ = absl::lts_20240722::MakeSpan<char>(ptr,size);
      base64.len_ = (size_type)field;
      base64.ptr_ = local_b8;
      DecodeBase64InPlace((StatusOr<absl::lts_20240722::Span<char>_> *)local_b0,
                          (anon_unknown_5 *)local_c8._8_8_,base64);
      bVar2 = absl::lts_20240722::StatusOr<absl::lts_20240722::Span<char>_>::ok
                        ((StatusOr<absl::lts_20240722::Span<char>_> *)local_b0);
      uVar1 = decoded.super_StatusOrData<absl::lts_20240722::Span<char>_>.field_1.data_.len_;
      if (bVar2) {
        this_00 = absl::lts_20240722::StatusOr<absl::lts_20240722::Span<char>_>::operator->
                            ((StatusOr<absl::lts_20240722::Span<char>_> *)local_b0);
        absl::lts_20240722::Span<char>::size(this_00);
        std::__cxx11::string::resize(uVar1);
      }
      else {
        pLVar5 = absl::lts_20240722::
                 StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                 ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                               *)&_status);
        pSVar4 = absl::lts_20240722::StatusOr<absl::lts_20240722::Span<char>_>::status
                           ((StatusOr<absl::lts_20240722::Span<char>_> *)local_b0);
        sVar6 = absl::lts_20240722::Status::message(pSVar4);
        JsonLocation::SourceLocation::current();
        JsonLocation::Invalid((JsonLocation *)local_c8,&pLVar5->loc,sVar6._M_len,sVar6._M_str);
        absl::lts_20240722::
        StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        StatusOr<absl::lts_20240722::Status,_0>(__return_storage_ptr__,(Status *)local_c8);
        absl::lts_20240722::Status::~Status((Status *)local_c8);
      }
      absl::lts_20240722::StatusOr<absl::lts_20240722::Span<char>_>::~StatusOr
                ((StatusOr<absl::lts_20240722::Span<char>_> *)local_b0);
      if (!bVar2) goto LAB_004b65f9;
    }
    pLVar5 = absl::lts_20240722::
             StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
             ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)&_status);
    u = MaybeOwnedString::ToString_abi_cxx11_(&pLVar5->value);
    absl::lts_20240722::
    StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (__return_storage_ptr__,u);
  }
LAB_004b65f9:
  absl::lts_20240722::
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  ::~StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
               *)&_status);
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<std::string> ParseStrOrBytes(JsonLexer& lex,
                                            Field<Traits> field) {
  absl::StatusOr<LocationWith<MaybeOwnedString>> str = lex.ParseUtf8();
  RETURN_IF_ERROR(str.status());

  if (Traits::FieldType(field) == FieldDescriptor::TYPE_BYTES) {
    std::string& b64 = str->value.ToString();
    absl::StatusOr<absl::Span<char>> decoded =
        DecodeBase64InPlace(absl::MakeSpan(&b64[0], b64.size()));
    if (!decoded.ok()) {
      return str->loc.Invalid(decoded.status().message());
    }
    b64.resize(decoded->size());
  }

  return std::move(str->value.ToString());
}